

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SimplePragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::syntax::SimplePragmaExpressionSyntax_const&>
          (BumpAllocator *this,SimplePragmaExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SimplePragmaExpressionSyntax *pSVar8;
  
  pSVar8 = (SimplePragmaExpressionSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->value).kind;
  uVar5 = (args->value).field_0x2;
  NVar6.raw = (args->value).numFlags.raw;
  uVar7 = (args->value).rawLen;
  (pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.kind =
       (args->super_PragmaExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  (pSVar8->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pSVar8->value).kind = TVar4;
  (pSVar8->value).field_0x2 = uVar5;
  (pSVar8->value).numFlags = (NumericTokenFlags)NVar6.raw;
  (pSVar8->value).rawLen = uVar7;
  (pSVar8->value).info = (args->value).info;
  return pSVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }